

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffcpsr(fitsfile *infptr,fitsfile *outfptr,LONGLONG firstrow,LONGLONG nrows,char *row_status,
          int *status)

{
  int iVar1;
  fitsfile *fptr;
  void *__ptr;
  LONGLONG *length;
  int *in_RCX;
  long in_RDX;
  int *in_RSI;
  int *in_RDI;
  long in_R8;
  int *in_R9;
  int *unaff_retaddr;
  uchar *varColBuff1;
  LONGLONG n_good_rows;
  tcolumn *colptr;
  LONGLONG hoffset;
  LONGLONG hrepeat;
  long nNewBlocks;
  int *outVarCols;
  int *inVarCols;
  int varColDiff;
  int nOutVarCols;
  int nInVarCols;
  uchar *varColBuff;
  uchar *buffer;
  LONGLONG nVarAllocBytes;
  LONGLONG nVarBytes;
  LONGLONG outPos;
  LONGLONG inPos;
  LONGLONG iVarCol;
  LONGLONG icol;
  LONGLONG i0;
  LONGLONG jj;
  LONGLONG ii;
  LONGLONG outnaxis2;
  LONGLONG outnaxis1;
  LONGLONG innaxis2;
  LONGLONG innaxis1;
  int *in_stack_00001620;
  int in_stack_0000162c;
  long in_stack_00001630;
  fitsfile *in_stack_00001638;
  char *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  int *piVar2;
  int *nvarcols;
  fitsfile *fptr_00;
  fitsfile *status_00;
  fitsfile *in_stack_ffffffffffffff28;
  int *piVar3;
  uint in_stack_ffffffffffffff40;
  int colnum;
  int iVar4;
  int iVar5;
  int *keyname;
  fitsfile *in_stack_ffffffffffffff58;
  fitsfile *status_01;
  fitsfile *in_stack_ffffffffffffff68;
  long in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  long in_stack_ffffffffffffff80;
  fitsfile *in_stack_ffffffffffffff88;
  long local_70;
  long local_60;
  size_t local_50;
  long local_48;
  size_t local_40;
  int local_4;
  
  status_01 = (fitsfile *)0x0;
  keyname = (int *)0x0;
  iVar5 = 0;
  iVar4 = 0;
  colnum = 0;
  piVar3 = (int *)0x0;
  status_00 = (fitsfile *)0x0;
  fptr_00 = (fitsfile *)0x0;
  nvarcols = (int *)0x0;
  if (*in_R9 < 1) {
    piVar2 = in_RCX;
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if (*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) {
        ffrdef((fitsfile *)varColBuff1,unaff_retaddr);
      }
    }
    else {
      ffmahd(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             &in_stack_ffffffffffffff68->HDUposition,(int *)0x0);
    }
    if (*in_RSI == *(int *)(*(long *)(in_RSI + 2) + 0x54)) {
      if (*(long *)(*(long *)(in_RSI + 2) + 0x88) == -1) {
        ffrdef((fitsfile *)varColBuff1,unaff_retaddr);
      }
    }
    else {
      ffmahd(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             &in_stack_ffffffffffffff68->HDUposition,&status_01->HDUposition);
    }
    if (*in_R9 < 1) {
      if ((*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) ||
         (*(int *)(*(long *)(in_RSI + 2) + 0x58) == 0)) {
        ffpmsg((char *)0x132151);
        *in_R9 = 0xeb;
        local_4 = 0xeb;
      }
      else if (((*(int *)(*(long *)(in_RDI + 2) + 0x58) == 2) &&
               (*(int *)(*(long *)(in_RSI + 2) + 0x58) == 1)) ||
              ((*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1 &&
               (*(int *)(*(long *)(in_RSI + 2) + 0x58) == 2)))) {
        ffpmsg((char *)0x1321c3);
        *in_R9 = 0xe3;
        local_4 = 0xe3;
      }
      else {
        ffgkyjj(in_stack_ffffffffffffff58,(char *)keyname,(LONGLONG *)CONCAT44(iVar5,iVar4),
                (char *)CONCAT44(colnum,in_stack_ffffffffffffff40),piVar3);
        ffgkyjj(in_stack_ffffffffffffff58,(char *)keyname,(LONGLONG *)CONCAT44(iVar5,iVar4),
                (char *)CONCAT44(colnum,in_stack_ffffffffffffff40),piVar3);
        ffgkyjj(in_stack_ffffffffffffff58,(char *)keyname,(LONGLONG *)CONCAT44(iVar5,iVar4),
                (char *)CONCAT44(colnum,in_stack_ffffffffffffff40),piVar3);
        ffgkyjj(in_stack_ffffffffffffff58,(char *)keyname,(LONGLONG *)CONCAT44(iVar5,iVar4),
                (char *)CONCAT44(colnum,in_stack_ffffffffffffff40),piVar3);
        if (*in_R9 < 1) {
          if (local_50 == local_40) {
            if (local_48 < (long)in_RCX + in_RDX + -1) {
              ffpmsg((char *)0x13230a);
              *in_R9 = 0x133;
              local_4 = 0x133;
            }
            else if (*(int *)(*(long *)(in_RDI + 2) + 0x3b0) ==
                     *(int *)(*(long *)(in_RSI + 2) + 0x3b0)) {
              fptr = (fitsfile *)malloc(local_40);
              if (fptr == (fitsfile *)0x0) {
                ffpmsg((char *)0x13239e);
                *in_R9 = 0x71;
                local_4 = 0x71;
              }
              else {
                __ptr = malloc((long)*(int *)(*(long *)(in_RDI + 2) + 0x3b0) << 2);
                length = (LONGLONG *)malloc((long)*(int *)(*(long *)(in_RSI + 2) + 0x3b0) << 2);
                fffvcl(fptr_00,nvarcols,piVar2,in_stack_ffffffffffffff00);
                fffvcl(fptr_00,nvarcols,piVar2,in_stack_ffffffffffffff00);
                if (iVar5 == iVar4) {
                  for (local_60 = 0; local_60 < iVar5; local_60 = local_60 + 1) {
                    if (*(int *)((long)__ptr + local_60 * 4) !=
                        *(int *)((long)length + local_60 * 4)) {
                      colnum = 1;
                      break;
                    }
                  }
                }
                else {
                  colnum = 1;
                }
                if (colnum == 0) {
                  if (iVar5 == 0) {
                    piVar2 = (int *)0x0;
                    for (local_70 = 0; local_70 < (long)in_RCX; local_70 = local_70 + 1) {
                      if ((in_R8 == 0) || (*(char *)(in_R8 + local_70) != '\0')) {
                        ffgtbb(in_stack_ffffffffffffff28,(LONGLONG)status_00,(LONGLONG)fptr_00,
                               (LONGLONG)nvarcols,(uchar *)piVar2,in_stack_ffffffffffffff00);
                        ffptbb(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                               (LONGLONG)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                               (uchar *)in_stack_ffffffffffffff68,&status_01->HDUposition);
                        piVar2 = (int *)((long)piVar2 + 1);
                      }
                    }
                  }
                  else {
                    if (in_R8 != 0) {
                      piVar2 = (int *)0x0;
                      for (local_60 = 0; local_60 < (long)in_RCX; local_60 = local_60 + 1) {
                        if (*(char *)(in_R8 + local_60) != '\0') {
                          piVar2 = (int *)((long)piVar2 + 1);
                        }
                      }
                    }
                    ffirow(fptr,(LONGLONG)keyname,CONCAT44(iVar5,iVar4),
                           (int *)(ulong)in_stack_ffffffffffffff40);
                    for (local_70 = 0; local_70 < (long)in_RCX; local_70 = local_70 + 1) {
                      if ((in_R8 == 0) || (*(char *)(in_R8 + local_70) != '\0')) {
                        ffgtbb(in_stack_ffffffffffffff28,(LONGLONG)status_00,(LONGLONG)fptr_00,
                               (LONGLONG)nvarcols,(uchar *)piVar2,in_stack_ffffffffffffff00);
                        ffptbb(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                               (LONGLONG)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                               (uchar *)in_stack_ffffffffffffff68,&status_01->HDUposition);
                        in_stack_ffffffffffffff80 = 0;
                        nvarcols = *(int **)(*(long *)(in_RDI + 2) + 0x3d0);
                        for (in_stack_ffffffffffffff88 = (fitsfile *)0x0;
                            (long)in_stack_ffffffffffffff88 <
                            (long)*(int *)(*(long *)(in_RDI + 2) + 0x3b0);
                            in_stack_ffffffffffffff88 =
                                 (fitsfile *)((long)&in_stack_ffffffffffffff88->HDUposition + 1)) {
                          piVar3 = keyname;
                          if ((in_stack_ffffffffffffff80 < iVar5) &&
                             ((undefined1 *)
                              (long)*(int *)((long)__ptr + in_stack_ffffffffffffff80 * 4) ==
                              (undefined1 *)((long)&in_stack_ffffffffffffff88->HDUposition + 1))) {
                            ffgdesll((fitsfile *)CONCAT44(iVar5,iVar4),colnum,(LONGLONG)__ptr,length
                                     ,(LONGLONG *)in_stack_ffffffffffffff28,&status_00->HDUposition)
                            ;
                            if (nvarcols[0x14] == -1) {
                              in_stack_ffffffffffffff68 =
                                   (fitsfile *)((long)&status_00->field_0x7 / 8);
                            }
                            else {
                              in_stack_ffffffffffffff68 = status_00;
                              if (nvarcols[0x14] != -0x10) {
                                in_stack_ffffffffffffff68 =
                                     (fitsfile *)((long)status_00 * *(long *)(nvarcols + 0x26));
                              }
                            }
                            in_stack_ffffffffffffff78 =
                                 (fitsfile *)
                                 ((long)&fptr_00->HDUposition +
                                 *(long *)(*(long *)(in_RDI + 2) + 0x88) +
                                 *(long *)(*(long *)(in_RDI + 2) + 0x3d8));
                            in_stack_ffffffffffffff70 =
                                 *(long *)(*(long *)(in_RSI + 2) + 0x88) +
                                 *(long *)(*(long *)(in_RSI + 2) + 0x3d8) +
                                 *(long *)(*(long *)(in_RSI + 2) + 0x3e0);
                            ffmbyt(fptr_00,(LONGLONG)nvarcols,(int)((ulong)piVar2 >> 0x20),
                                   in_stack_ffffffffffffff00);
                            if ((*(int *)(*(long *)(in_RSI + 2) + 0x38) == 0) &&
                               (*(long *)(*(long *)(*(long *)(in_RSI + 2) + 0x68) +
                                         (long)(*(int *)(*(long *)(in_RSI + 2) + 0x54) + 1) * 8) <
                                (long)&in_stack_ffffffffffffff68->HDUposition +
                                in_stack_ffffffffffffff70)) {
                              in_stack_ffffffffffffff28 =
                                   (fitsfile *)
                                   (((long)in_stack_ffffffffffffff68 +
                                    ((in_stack_ffffffffffffff70 + -1) -
                                    *(long *)(*(long *)(*(long *)(in_RSI + 2) + 0x68) +
                                             (long)(*(int *)(*(long *)(in_RSI + 2) + 0x54) + 1) * 8)
                                    )) / 0xb40 + 1);
                              iVar1 = ffiblk(in_stack_00001638,in_stack_00001630,in_stack_0000162c,
                                             in_stack_00001620);
                              if (0 < iVar1) {
                                ffpmsg((char *)0x1328b8);
                                goto LAB_00132bbd;
                              }
                            }
                            piVar3 = keyname;
                            if (in_stack_ffffffffffffff68 != (fitsfile *)0x0) {
                              if (((long)status_01 < (long)in_stack_ffffffffffffff68) &&
                                 (status_01 = in_stack_ffffffffffffff68,
                                 in_stack_ffffffffffffff00 =
                                      (int *)realloc(keyname,(size_t)in_stack_ffffffffffffff68),
                                 piVar3 = in_stack_ffffffffffffff00,
                                 in_stack_ffffffffffffff68 = status_01,
                                 in_stack_ffffffffffffff00 == (int *)0x0)) {
                                *in_R9 = 0x71;
                                ffpmsg((char *)0x13290f);
                                goto LAB_00132bbd;
                              }
                              ffgbyt(fptr,(LONGLONG)piVar3,(void *)CONCAT44(iVar5,iVar4),
                                     (int *)CONCAT44(colnum,in_stack_ffffffffffffff40));
                              ffmbyt(fptr_00,(LONGLONG)nvarcols,(int)((ulong)piVar2 >> 0x20),
                                     in_stack_ffffffffffffff00);
                              ffpbyt(in_stack_ffffffffffffff68,(LONGLONG)status_01,fptr,piVar3);
                            }
                            ffpdes((fitsfile *)CONCAT44(iVar5,iVar4),colnum,(LONGLONG)__ptr,
                                   (LONGLONG)length,(LONGLONG)in_stack_ffffffffffffff28,
                                   &status_00->HDUposition);
                            *(long *)(*(long *)(in_RSI + 2) + 0x3e0) =
                                 (long)&in_stack_ffffffffffffff68->HDUposition +
                                 *(long *)(*(long *)(in_RSI + 2) + 0x3e0);
                            in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + 1;
                          }
                          nvarcols = nvarcols + 0x28;
                          keyname = piVar3;
                        }
                      }
                    }
                  }
                  ffuky(fptr_00,(int)((ulong)nvarcols >> 0x20),(char *)piVar2,
                        in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)0x132bbd);
                }
                else {
                  ffpmsg((char *)0x1324c7);
                  *in_R9 = 0x12e;
                }
LAB_00132bbd:
                free(fptr);
                free(__ptr);
                free(length);
                if (keyname != (int *)0x0) {
                  free(keyname);
                }
                local_4 = *in_R9;
              }
            }
            else {
              ffpmsg((char *)0x13235a);
              *in_R9 = 0x12e;
              local_4 = 0x12e;
            }
          }
          else {
            ffpmsg((char *)0x1322c2);
            *in_R9 = 0xf1;
            local_4 = 0xf1;
          }
        }
        else {
          local_4 = *in_R9;
        }
      }
    }
    else {
      local_4 = *in_R9;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffcpsr(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           LONGLONG firstrow,   /* I - number of first row to copy (1 based)  */
           LONGLONG nrows,      /* I - number of rows to copy  */
	   char *row_status,    /* I - quality list of rows to keep (1) or not keep (0) */
           int *status)         /* IO - error status     */
/*
  copy consecutive set of rows from infptr and append it in the outfptr table.
*/
{
    LONGLONG innaxis1, innaxis2, outnaxis1, outnaxis2, ii, jj, i0, icol;
    LONGLONG iVarCol, inPos, outPos, nVarBytes, nVarAllocBytes = 0;
    unsigned char *buffer, *varColBuff=0;
    int nInVarCols=0, nOutVarCols=0, varColDiff=0;
    int *inVarCols=0, *outVarCols=0;
    long nNewBlocks;
    LONGLONG hrepeat=0, hoffset=0;
    tcolumn *colptr=0;
    LONGLONG n_good_rows = nrows;
    
    if (*status > 0)
        return(*status);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */

    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */

    if (*status > 0)
        return(*status);

    if ((infptr->Fptr)->hdutype == IMAGE_HDU || (outfptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy rows to or from IMAGE HDUs (ffcprw)");
       return(*status = NOT_TABLE);
    }

    if ( ((infptr->Fptr)->hdutype == BINARY_TBL &&  (outfptr->Fptr)->hdutype == ASCII_TBL) ||
         ((infptr->Fptr)->hdutype == ASCII_TBL &&  (outfptr->Fptr)->hdutype == BINARY_TBL) )
    {
       ffpmsg
       ("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
       return(*status = NOT_BTABLE);
    }

    ffgkyjj(infptr,  "NAXIS1", &innaxis1,  0, status);  /* width of input rows */
    ffgkyjj(infptr,  "NAXIS2", &innaxis2,  0, status);  /* no. of input rows */
    ffgkyjj(outfptr, "NAXIS1", &outnaxis1, 0, status);  /* width of output rows */
    ffgkyjj(outfptr, "NAXIS2", &outnaxis2, 0, status);  /* no. of output rows */

    if (*status > 0)
        return(*status);

    if (outnaxis1 != innaxis1) {
       ffpmsg
       ("Input and output tables do not have same width (ffcprw)");
       return(*status = BAD_ROW_WIDTH);
    }    

    if (firstrow + nrows - 1 > innaxis2) {
       ffpmsg
       ("Not enough rows in input table to copy (ffcprw)");
       return(*status = BAD_ROW_NUM);
    }
    
    if ((infptr->Fptr)->tfield != (outfptr->Fptr)->tfield)
    {
       ffpmsg
       ("Input and output tables do not have same number of columns (ffcprw)");
       return(*status = BAD_COL_NUM);
    }
    
    /* allocate buffer to hold 1 row of data */
    buffer = malloc( (size_t) innaxis1);
    if (!buffer) {
       ffpmsg
       ("Unable to allocate memory (ffcprw)");
       return(*status = MEMORY_ALLOCATION);
    }
 
    inVarCols = malloc(infptr->Fptr->tfield*sizeof(int));
    outVarCols = malloc(outfptr->Fptr->tfield*sizeof(int));
    fffvcl(infptr, &nInVarCols, inVarCols, status);
    fffvcl(outfptr, &nOutVarCols, outVarCols, status);
    if (nInVarCols != nOutVarCols)
       varColDiff=1;
    else
    {
       for (ii=0; ii<nInVarCols; ++ii)
       {
          if (inVarCols[ii] != outVarCols[ii])
          {
             varColDiff=1;
             break;
          }
       }
    }
    
    if (varColDiff)
    {
       ffpmsg("Input and output tables have different variable columns (ffcprw)");
       *status = BAD_COL_NUM;
       goto CLEANUP_RETURN;
    }
    
    jj = outnaxis2 + 1;
    if (nInVarCols)
    {
      if (row_status) {
	for (n_good_rows = 0, ii = 0; ii < nrows; ii++) {
	  if (row_status[ii]) n_good_rows++; 
	}
      }

       ffirow(outfptr, outnaxis2, n_good_rows, status);
       for (ii = firstrow, i0 = 0; i0 < nrows; i0++, ii++)
       {
	  /* Ignore rows with row_status[] == 0 */
	  if (row_status && !row_status[i0]) continue;

          fits_read_tblbytes (infptr, ii, 1, innaxis1, buffer, status);
          fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
          /* Now make corrections for variable length columns */
          iVarCol=0;
          colptr = (infptr->Fptr)->tableptr;
          for (icol=0; icol<(infptr->Fptr)->tfield; ++icol)
          {
             if (iVarCol < nInVarCols && inVarCols[iVarCol] == icol+1)
             {
                /* Copy from a variable length column */
                
                ffgdesll(infptr, icol+1, ii, &hrepeat, &hoffset, status);
                /* If this is a bit column, hrepeat will be number of
                   bits, not bytes. If it is a string column, hrepeat
		   is the number of bytes, twidth is the max col width 
		   and can be ignored.*/
                if (colptr->tdatatype == -TBIT)
		{
		   nVarBytes = (hrepeat+7)/8;
		}
		else if (colptr->tdatatype == -TSTRING)
		{
		   nVarBytes = hrepeat;
		}
		else
		{
		   nVarBytes = hrepeat*colptr->twidth*sizeof(char);
		}
                inPos = (infptr->Fptr)->datastart + (infptr->Fptr)->heapstart
				+ hoffset;
		outPos = (outfptr->Fptr)->datastart + (outfptr->Fptr)->heapstart
				+ (outfptr->Fptr)->heapsize;
                ffmbyt(infptr, inPos, REPORT_EOF, status);
		/* If this is not the last HDU in the file, then check if */
		/* extending the heap would overwrite the following header. */
		/* If so, then have to insert more blocks. */
                if ( !((outfptr->Fptr)->lasthdu) )
                {
		   if (outPos+nVarBytes > 
		      (outfptr->Fptr)->headstart[(outfptr->Fptr)->curhdu+1])
		   {
		      nNewBlocks = (long)(((outPos+nVarBytes - 1 -
                        (outfptr->Fptr)->headstart[(outfptr->Fptr)->
                        curhdu+1]) / 2880) + 1);
                      if (ffiblk(outfptr, nNewBlocks, 1, status) > 0)
                      {
                         ffpmsg("Failed to extend the size of the variable length heap (ffcprw)");
			 goto CLEANUP_RETURN;
                      }

		   }
                }
                if (nVarBytes)
		{
		   if (nVarBytes > nVarAllocBytes)
		   {
		     /* Grow the copy buffer to accomodate the new maximum size. 
			Note it is safe to call realloc() with null input pointer, 
			which is equivalent to malloc(). */
		     unsigned char *varColBuff1 = (unsigned char *) realloc(varColBuff, nVarBytes);
		     if (! varColBuff1)
		     {
		       *status = MEMORY_ALLOCATION;
		       ffpmsg("failed to allocate memory for variable column copy (ffcprw)");
		       goto CLEANUP_RETURN;
		     }
		     /* Record the new state */
		     varColBuff = varColBuff1;
		     nVarAllocBytes = nVarBytes;
		   }
		   /* Copy date from input to output */
                   ffgbyt(infptr, nVarBytes, varColBuff, status);
		   ffmbyt(outfptr, outPos, IGNORE_EOF, status);
                   ffpbyt(outfptr, nVarBytes, varColBuff, status);
		}
		ffpdes(outfptr, icol+1, jj, hrepeat, (outfptr->Fptr)->heapsize, status);
                (outfptr->Fptr)->heapsize += nVarBytes;
                ++iVarCol;
             }
             ++colptr;
          }
          ++jj;
       }
    }
    else
    {    
       /* copy the rows, 1 at a time */
       n_good_rows = 0;
       for (ii = firstrow, i0 = 0; i0 < nrows; i0++, ii++)
       {
	  /* Ignore rows with row_status[] == 0 */
	  if (row_status && !row_status[i0]) continue;

           fits_read_tblbytes (infptr,  ii, 1, innaxis1, buffer, status);
           fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
	   n_good_rows ++;
           jj++;
       }
    }
    outnaxis2 += n_good_rows;
    fits_update_key(outfptr, TLONGLONG, "NAXIS2", &outnaxis2, 0, status);

 CLEANUP_RETURN:
    free(buffer);
    free(inVarCols);
    free(outVarCols);
    if (varColBuff) free(varColBuff);
    return(*status);
}